

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O3

void __thiscall
fizplex::BaseTestSingular_InvertIsFalse_Test::TestBody(BaseTestSingular_InvertIsFalse_Test *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  Base b;
  ColMatrix m;
  long alStack_138 [3];
  undefined1 local_120 [56];
  _Head_base<0UL,_unsigned_long_*,_false> local_e8;
  Nonzero local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ColMatrix local_a0;
  Nonzero local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Nonzero local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_b8 = 2;
  uStack_b0 = 0x3ff0000000000000;
  local_c8 = 1;
  uStack_c0 = 0x3ff0000000000000;
  local_d8.index = 0;
  local_d8.value = 1.0;
  alStack_138[1] = 0x161243;
  l._M_len = 3;
  l._M_array = &local_d8;
  SVector::SVector((SVector *)local_120,l);
  local_28 = 2;
  uStack_20 = 0x3ff0000000000000;
  local_38 = 1;
  uStack_30 = 0x3ff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  alStack_138[1] = 0x16127d;
  l_00._M_len = 3;
  l_00._M_array = &local_48;
  SVector::SVector((SVector *)(local_120 + 0x18),l_00);
  local_58 = 2;
  uStack_50 = 0x3ff0000000000000;
  local_68 = 1;
  uStack_60 = 0x3ff0000000000000;
  local_78.index = 0;
  local_78.value = 1.0;
  alStack_138[1] = 0x1612b7;
  l_01._M_len = 3;
  l_01._M_array = &local_78;
  SVector::SVector((SVector *)(local_120 + 0x30),l_01);
  alStack_138[1] = 0x1612d9;
  colList._M_len = 3;
  colList._M_array = (iterator)local_120;
  ColMatrix::ColMatrix(&local_a0,3,3,colList);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)alStack_138 + lVar3);
    if (pvVar1 != (void *)0x0) {
      alStack_138[1] = 0x1612f4;
      operator_delete(pvVar1,*(long *)((long)alStack_138 + lVar3 + 0x10) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  alStack_138[1] = 0x1612ff;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    alStack_138[1] = 0x16131c;
    Base::Base((Base *)local_120,&local_a0);
    if ((_Head_base<0UL,_unsigned_long_*,_false>)local_e8._M_head_impl !=
        (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
      alStack_138[1] = 0x16132b;
      operator_delete__(local_e8._M_head_impl);
    }
    local_e8._M_head_impl = (unsigned_long *)0x0;
    alStack_138[1] = 0x161341;
    operator_delete((void *)local_120._32_8_);
    alStack_138[1] = 0x161349;
    std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::~vector
              ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)local_120);
  }
  alStack_138[1] = 0x161353;
  testing::Message::Message((Message *)local_120);
  alStack_138[1] = 0x161371;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
             ,0xc,
             "Expected: Base b(m) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  alStack_138[1] = 0x161380;
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_120);
  alStack_138[1] = 0x16138a;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  if ((pointer)local_120._0_8_ != (pointer)0x0) {
    alStack_138[1] = 0x16139c;
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      alStack_138[1] = 0x1613b0;
      (**(code **)(*(long *)local_120._0_8_ + 8))();
    }
  }
  alStack_138[1] = 0x1613bd;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_a0.cols);
  return;
}

Assistant:

TEST(BaseTestSingular, InvertIsFalse) {
  const ColMatrix m(3, 3,
                    {{{0, 1}, {1, 1}, {2, 1}},
                     {{0, 1}, {1, 1}, {2, 1}},
                     {{0, 1}, {1, 1}, {2, 1}}});
  EXPECT_THROW(Base b(m), std::invalid_argument);
}